

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *config)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  char local_509;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_508;
  string prop_filename;
  string dest;
  string filename_config;
  string se;
  string fileName;
  string local_450;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])
            (&cxx_modules_dirname,this);
  if (cxx_modules_dirname._M_string_length == 0) {
    bVar4 = true;
  }
  else {
    std::__cxx11::string::string((string *)&filename_config,(string *)config);
    if (filename_config._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&filename_config);
    }
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)(this->super_cmExportFileGenerator).FileDir._M_string_length;
    _e = 1;
    se._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char>
              (&dest,(cmAlphaNum *)&os,(cmAlphaNum *)&e,&cxx_modules_dirname,(char *)&se);
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)dest._M_string_length;
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         dest._M_dataplus._M_p;
    _e = 0xc;
    cmStrCat<std::__cxx11::string,char[7]>
              (&fileName,(cmAlphaNum *)&os,(cmAlphaNum *)&e,&filename_config,(char (*) [7])0x64a37d)
    ;
    cmGeneratedFileStream::cmGeneratedFileStream(&os,&fileName,true,None);
    bVar4 = ((&os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream[-3]] & 5) == 0;
    if (bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent(&os,true);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigCxxModuleFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      local_508 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->ConfigCxxModuleTargetFiles,config);
      for (p_Var3 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 !=
          &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        _e = 7;
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_450,*(cmGeneratorTarget **)(p_Var3 + 1));
        se._M_dataplus._M_p = (pointer)local_450._M_string_length;
        se._M_string_length = (size_type)local_450._M_dataplus._M_p;
        local_509 = '-';
        cmStrCat<char,std::__cxx11::string,char[7]>
                  (&prop_filename,(cmAlphaNum *)&e,(cmAlphaNum *)&se,&local_509,&filename_config,
                   (char (*) [7])0x64a37d);
        std::__cxx11::string::~string((string *)&local_450);
        _e = dest._M_string_length;
        se._M_dataplus._M_p = (pointer)prop_filename._M_string_length;
        se._M_string_length = (size_type)prop_filename._M_dataplus._M_p;
        cmStrCat<>(&local_450,(cmAlphaNum *)&e,(cmAlphaNum *)&se);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_508,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        poVar1 = std::operator<<((ostream *)&os,"include(\"${CMAKE_CURRENT_LIST_DIR}/");
        poVar1 = std::operator<<(poVar1,(string *)&prop_filename);
        std::operator<<(poVar1,"\")\n");
        std::__cxx11::string::~string((string *)&prop_filename);
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar1 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar1 = std::operator<<(poVar1,(string *)&fileName);
      poVar1 = std::operator<<(poVar1,"\": ");
      std::operator<<(poVar1,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&prop_filename);
      std::__cxx11::string::~string((string *)&prop_filename);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&os);
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&filename_config);
  }
  std::__cxx11::string::~string((string *)&cxx_modules_dirname);
  return bVar4;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}